

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BrokerBase.cpp
# Opt level: O2

shared_ptr<helics::helicsCLI11App> __thiscall helics::BrokerBase::generateBaseCLI(BrokerBase *this)

{
  long lVar1;
  HelicsConfigJSON *pHVar2;
  Option *pOVar3;
  Option *this_00;
  App *pAVar4;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long in_RSI;
  initializer_list<const_char_*> values;
  shared_ptr<helics::helicsCLI11App> sVar5;
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_a58;
  allocator<char> local_a33;
  allocator<char> local_a32;
  allocator<char> local_a31;
  Validator local_a30;
  string local_9c8;
  char *local_9a8;
  char *pcStack_9a0;
  char *local_998;
  char *pcStack_990;
  string local_988;
  string local_968;
  string local_948;
  string local_928;
  string local_908;
  string local_8e8;
  string local_8c8;
  string local_8a8;
  string local_888;
  string local_868;
  string local_848;
  string local_828;
  string local_808;
  string local_7e8;
  string local_7c8;
  string local_7a8;
  string local_788;
  string local_768;
  string local_748;
  string local_728;
  string local_708;
  string local_6e8;
  string local_6c8;
  string local_6a8;
  string local_688;
  string local_668;
  string local_648;
  string local_628;
  string local_608;
  string local_5e8;
  string local_5c8;
  string local_5a8;
  string local_588;
  string local_568;
  string local_548;
  string local_528;
  string local_508;
  string local_4e8;
  string local_4c8;
  string local_4a8;
  string local_488;
  string local_468;
  string local_448;
  string local_428;
  string local_408;
  string local_3e8;
  string local_3c8;
  string local_3a8;
  string local_388;
  string local_368;
  string local_348;
  string local_328;
  string local_308;
  string local_2e8;
  string local_2c8;
  string local_2a8;
  string local_288;
  string local_268;
  string local_248;
  string local_228;
  string local_208;
  string local_1e8;
  string local_1c8;
  string local_1a8;
  string local_188;
  string local_168;
  string local_148;
  string local_128;
  string local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  Validator local_88;
  
  std::make_shared<helics::helicsCLI11App,char_const(&)[44]>((char (*) [44])this);
  pHVar2 = addJsonConfig((App *)this->_vptr_BrokerBase);
  (pHVar2->super_ConfigBase).maximumLayers = '\0';
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a8,"helics",(allocator<char> *)&local_a30);
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&pHVar2->mPromoteSection,&local_a8);
  std::__cxx11::string::~string((string *)&local_a8);
  pAVar4 = (App *)this->_vptr_BrokerBase;
  (pAVar4->option_defaults_).super_OptionBase<CLI::OptionDefaults>.ignore_case_ = true;
  (pAVar4->option_defaults_).super_OptionBase<CLI::OptionDefaults>.ignore_underscore_ = true;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_128,"--federates,-f",(allocator<char> *)&local_a30);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_148,"the minimum number of federates that will be connecting",
             (allocator<char> *)&local_a58);
  CLI::App::add_option<int,_int,_(CLI::detail::enabler)0>
            (pAVar4,&local_128,(int *)(in_RSI + 0x18),&local_148);
  std::__cxx11::string::~string((string *)&local_148);
  std::__cxx11::string::~string((string *)&local_128);
  pAVar4 = (App *)this->_vptr_BrokerBase;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_168,"--maxfederates",(allocator<char> *)&local_a30);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_188,"the maximum number of federates that will be connecting",
             (allocator<char> *)&local_a58);
  CLI::App::add_option<int,_int,_(CLI::detail::enabler)0>
            (pAVar4,&local_168,(int *)(in_RSI + 0x20),&local_188);
  std::__cxx11::string::~string((string *)&local_188);
  std::__cxx11::string::~string((string *)&local_168);
  pAVar4 = (App *)this->_vptr_BrokerBase;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1a8,"--name,-n,--identifier,--uuid",(allocator<char> *)&local_a30);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1c8,"the name of the broker/core",(allocator<char> *)&local_a58);
  CLI::App::
  add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
            (pAVar4,&local_1a8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(in_RSI + 0x68),
             &local_1c8);
  std::__cxx11::string::~string((string *)&local_1c8);
  std::__cxx11::string::~string((string *)&local_1a8);
  pAVar4 = (App *)this->_vptr_BrokerBase;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1e8,"--max_iterations",(allocator<char> *)&local_a30);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_208,"the maximum number of iterations allowed",
             (allocator<char> *)&local_a58);
  pOVar3 = CLI::App::add_option<int,_int,_(CLI::detail::enabler)0>
                     (pAVar4,&local_1e8,(int *)(in_RSI + 0x2c),&local_208);
  CLI::Option::capture_default_str(pOVar3);
  std::__cxx11::string::~string((string *)&local_208);
  std::__cxx11::string::~string((string *)&local_1e8);
  pAVar4 = (App *)this->_vptr_BrokerBase;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_228,"--minbrokers,--minbroker,--minbrokercount",
             (allocator<char> *)&local_a30);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_248,
             "the minimum number of cores/brokers that need to be connected (ignored in cores)",
             (allocator<char> *)&local_a58);
  CLI::App::add_option<int,_int,_(CLI::detail::enabler)0>
            (pAVar4,&local_228,(int *)(in_RSI + 0x1c),&local_248);
  std::__cxx11::string::~string((string *)&local_248);
  std::__cxx11::string::~string((string *)&local_228);
  pAVar4 = (App *)this->_vptr_BrokerBase;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_268,"--children,--subbrokers",(allocator<char> *)&local_a30);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_288,
             "the minimum number of child objects that need to be connected before entering init mode"
             ,(allocator<char> *)&local_a58);
  CLI::App::add_option<int,_int,_(CLI::detail::enabler)0>
            (pAVar4,&local_268,(int *)(in_RSI + 0x28),&local_288);
  std::__cxx11::string::~string((string *)&local_288);
  std::__cxx11::string::~string((string *)&local_268);
  pAVar4 = (App *)this->_vptr_BrokerBase;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2a8,"--maxbrokers",(allocator<char> *)&local_a30);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2c8,
             "the maximum number of brokers that will be connecting (ignored in cores)",
             (allocator<char> *)&local_a58);
  CLI::App::add_option<int,_int,_(CLI::detail::enabler)0>
            (pAVar4,&local_2a8,(int *)(in_RSI + 0x24),&local_2c8);
  std::__cxx11::string::~string((string *)&local_2c8);
  std::__cxx11::string::~string((string *)&local_2a8);
  pAVar4 = (App *)this->_vptr_BrokerBase;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2e8,"--brokerkey",(allocator<char> *)&local_a30);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_308,"specify a key to use for all connections to/from a broker",
             (allocator<char> *)&local_a58);
  pOVar3 = CLI::App::
           add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
                     (pAVar4,&local_2e8,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      (in_RSI + 0x88),&local_308);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c8,"HELICS_BROKER_KEY",(allocator<char> *)&local_9a8);
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&pOVar3->envname_,&local_c8);
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::~string((string *)&local_308);
  std::__cxx11::string::~string((string *)&local_2e8);
  pAVar4 = (App *)this->_vptr_BrokerBase;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_328,"--slowresponding",(allocator<char> *)&local_a30);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_348,
             "specify that a broker might be slow or unresponsive to ping requests from other brokers"
             ,(allocator<char> *)&local_a58);
  CLI::App::add_flag<bool,_(CLI::detail::enabler)0>
            (pAVar4,&local_328,(bool *)(in_RSI + 0x20d),&local_348);
  std::__cxx11::string::~string((string *)&local_348);
  std::__cxx11::string::~string((string *)&local_328);
  pAVar4 = (App *)this->_vptr_BrokerBase;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_368,"--restrictive_time_policy",(allocator<char> *)&local_a30);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_388,
             "specify that a broker should use a conservative time policy in the time coordinator",
             (allocator<char> *)&local_a58);
  CLI::App::add_flag<bool,_(CLI::detail::enabler)0>
            (pAVar4,&local_368,(bool *)(in_RSI + 0xd1),&local_388);
  std::__cxx11::string::~string((string *)&local_388);
  std::__cxx11::string::~string((string *)&local_368);
  pAVar4 = (App *)this->_vptr_BrokerBase;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3a8,"--debugging",(allocator<char> *)&local_a30);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3c8,
             "specify that a broker/core should operate in user debugging mode equivalent to --slow_responding --disable_timer"
             ,(allocator<char> *)&local_a58);
  CLI::App::add_flag<bool,_(CLI::detail::enabler)0>
            (pAVar4,&local_3a8,(bool *)(in_RSI + 0xd3),&local_3c8);
  std::__cxx11::string::~string((string *)&local_3c8);
  std::__cxx11::string::~string((string *)&local_3a8);
  pAVar4 = (App *)this->_vptr_BrokerBase;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3e8,"--allow_remote_control,!--disable_remote_control",
             (allocator<char> *)&local_a30);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_408,
             "enable the broker to respond to certain remote commands that affect operations, such as disconnect"
             ,(allocator<char> *)&local_a58);
  CLI::App::add_flag<bool,_(CLI::detail::enabler)0>
            (pAVar4,&local_3e8,(bool *)(in_RSI + 0x211),&local_408);
  std::__cxx11::string::~string((string *)&local_408);
  std::__cxx11::string::~string((string *)&local_3e8);
  pAVar4 = (App *)this->_vptr_BrokerBase;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_428,"--globaltime",(allocator<char> *)&local_a30);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_448,
             "specify that the broker should use a globalTime coordinator to coordinate a master clock time with all federates"
             ,(allocator<char> *)&local_a58);
  CLI::App::add_flag<bool,_(CLI::detail::enabler)0>
            (pAVar4,&local_428,(bool *)(in_RSI + 0xd5),&local_448);
  std::__cxx11::string::~string((string *)&local_448);
  std::__cxx11::string::~string((string *)&local_428);
  pAVar4 = (App *)this->_vptr_BrokerBase;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_468,"--global_disconnect",(allocator<char> *)&local_a30);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_488,
             "specify that all federates should delay disconnection until all are done",
             (allocator<char> *)&local_a58);
  CLI::App::add_flag<bool,_(CLI::detail::enabler)0>
            (pAVar4,&local_468,(bool *)(in_RSI + 0x213),&local_488);
  std::__cxx11::string::~string((string *)&local_488);
  std::__cxx11::string::~string((string *)&local_468);
  pAVar4 = (App *)this->_vptr_BrokerBase;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_4a8,"--asynctime",(allocator<char> *)&local_a30);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_4c8,
             "specify that the federation should use the asynchronous time coordinator (only minimal time management is handled in HELICS and federates are allowed to operate independently)"
             ,(allocator<char> *)&local_a58);
  CLI::App::add_flag<bool,_(CLI::detail::enabler)0>
            (pAVar4,&local_4a8,(bool *)(in_RSI + 0xd6),&local_4c8);
  std::__cxx11::string::~string((string *)&local_4c8);
  std::__cxx11::string::~string((string *)&local_4a8);
  pAVar4 = (App *)this->_vptr_BrokerBase;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_4e8,"--timing",&local_a31);
  local_a58.super__Function_base._M_functor._8_8_ = 0;
  local_a58._M_invoker =
       CLI::std::
       _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/core/BrokerBase.cpp:174:13)>
       ::_M_invoke;
  local_a58.super__Function_base._M_manager =
       CLI::std::
       _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/core/BrokerBase.cpp:174:13)>
       ::_M_manager;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_508,"specify the timing method to use in the broker",&local_a32);
  pOVar3 = CLI::App::add_option_function<std::__cxx11::string>
                     (pAVar4,&local_4e8,&local_a58,&local_508);
  local_998 = "distributed";
  pcStack_990 = "default";
  local_9a8 = "async";
  pcStack_9a0 = "global";
  values._M_len = 4;
  values._M_array = &local_9a8;
  CLI::IsMember::IsMember<char_const*>((IsMember *)&local_a30,values);
  CLI::Validator::Validator(&local_88,&local_a30);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_9c8,"",&local_a33);
  CLI::Option::check(pOVar3,&local_88,&local_9c8);
  std::__cxx11::string::~string((string *)&local_9c8);
  CLI::Validator::~Validator(&local_88);
  CLI::Validator::~Validator(&local_a30);
  std::__cxx11::string::~string((string *)&local_508);
  CLI::std::_Function_base::~_Function_base(&local_a58.super__Function_base);
  std::__cxx11::string::~string((string *)&local_4e8);
  pAVar4 = (App *)this->_vptr_BrokerBase;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_528,"--observer",(allocator<char> *)&local_a30);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_548,"specify that the broker/core should be added as an observer only"
             ,(allocator<char> *)&local_a58);
  CLI::App::add_flag<bool,_(CLI::detail::enabler)0>
            (pAVar4,&local_528,(bool *)(in_RSI + 0xd4),&local_548);
  std::__cxx11::string::~string((string *)&local_548);
  std::__cxx11::string::~string((string *)&local_528);
  pAVar4 = (App *)this->_vptr_BrokerBase;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_568,"--dynamic",(allocator<char> *)&local_a30);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_588,"specify that the broker/core should allow dynamic federates",
             (allocator<char> *)&local_a58);
  CLI::App::add_flag<bool,_(CLI::detail::enabler)0>
            (pAVar4,&local_568,(bool *)(in_RSI + 0xd7),&local_588);
  std::__cxx11::string::~string((string *)&local_588);
  std::__cxx11::string::~string((string *)&local_568);
  pAVar4 = (App *)this->_vptr_BrokerBase;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_5a8,"--disable_dynamic_sources",(allocator<char> *)&local_a30);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_5c8,
             "specify that the data sources must be registered before entering Initializing mode",
             (allocator<char> *)&local_a58);
  CLI::App::add_flag<bool,_(CLI::detail::enabler)0>
            (pAVar4,&local_5a8,(bool *)(in_RSI + 0xd8),&local_5c8);
  std::__cxx11::string::~string((string *)&local_5c8);
  std::__cxx11::string::~string((string *)&local_5a8);
  pAVar4 = (App *)this->_vptr_BrokerBase;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_5e8,"--json",(allocator<char> *)&local_a30);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_608,"use the JSON serialization mode for communications",
             (allocator<char> *)&local_a58);
  CLI::App::add_flag<bool,_(CLI::detail::enabler)0>
            (pAVar4,&local_5e8,(bool *)(in_RSI + 0x20f),&local_608);
  std::__cxx11::string::~string((string *)&local_608);
  std::__cxx11::string::~string((string *)&local_5e8);
  pAVar4 = (App *)this->_vptr_BrokerBase;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_628,"--profiler",(allocator<char> *)&local_a58);
  local_a30.desc_function_.super__Function_base._M_functor._8_8_ = 0;
  local_a30.desc_function_._M_invoker =
       CLI::std::
       _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/core/BrokerBase.cpp:204:17)>
       ::_M_invoke;
  local_a30.desc_function_.super__Function_base._M_manager =
       CLI::std::
       _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/core/BrokerBase.cpp:204:17)>
       ::_M_manager;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_648,
             "activate profiling and set the profiler data output file, set to empty string to disable profiling, set to \"log\" to route profile message to the logging system."
             ,(allocator<char> *)&local_9a8);
  pOVar3 = CLI::App::add_option_function<std::__cxx11::string>
                     (pAVar4,&local_628,
                      (function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                       *)&local_a30,&local_648);
  pOVar3->expected_min_ = 0;
  pOVar3->expected_max_ = 1;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e8,"log",(allocator<char> *)&local_9c8);
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&pOVar3->default_str_,&local_e8);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::~string((string *)&local_648);
  CLI::std::_Function_base::~_Function_base((_Function_base *)&local_a30);
  std::__cxx11::string::~string((string *)&local_628);
  pAVar4 = (App *)this->_vptr_BrokerBase;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_668,"--profiler_append",(allocator<char> *)&local_a58);
  local_a30.desc_function_.super__Function_base._M_functor._8_8_ = 0;
  local_a30.desc_function_._M_invoker =
       CLI::std::
       _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/core/BrokerBase.cpp:229:13)>
       ::_M_invoke;
  local_a30.desc_function_.super__Function_base._M_manager =
       CLI::std::
       _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/core/BrokerBase.cpp:229:13)>
       ::_M_manager;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_688,
             "activate profiling and set the profiler data output file; new profiler output will be appended to the file"
             ,(allocator<char> *)&local_9a8);
  this_00 = CLI::App::add_option_function<std::__cxx11::string>
                      (pAVar4,&local_668,
                       (function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                        *)&local_a30,&local_688);
  CLI::Option::excludes(this_00,pOVar3);
  std::__cxx11::string::~string((string *)&local_688);
  CLI::std::_Function_base::~_Function_base((_Function_base *)&local_a30);
  std::__cxx11::string::~string((string *)&local_668);
  pAVar4 = (App *)this->_vptr_BrokerBase;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_6a8,"--terminate_on_error",(allocator<char> *)&local_a30);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_6c8,
             "specify that a broker should cause the federation to terminate on an error",
             (allocator<char> *)&local_a58);
  CLI::App::add_flag<bool,_(CLI::detail::enabler)0>
            (pAVar4,&local_6a8,(bool *)(in_RSI + 0xd2),&local_6c8);
  std::__cxx11::string::~string((string *)&local_6c8);
  std::__cxx11::string::~string((string *)&local_6a8);
  pAVar4 = (App *)this->_vptr_BrokerBase;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_6e8,"--error_on_unmatched",(allocator<char> *)&local_a30);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_708,
             "set the broker to terminate the cosimulation if there are unmatched connections",
             (allocator<char> *)&local_a58);
  CLI::App::add_flag<bool,_(CLI::detail::enabler)0>
            (pAVar4,&local_6e8,(bool *)(in_RSI + 0x212),&local_708);
  std::__cxx11::string::~string((string *)&local_708);
  std::__cxx11::string::~string((string *)&local_6e8);
  LogManager::addLoggingCLI
            (*(LogManager **)(in_RSI + 0x1f8),(shared_ptr<helics::helicsCLI11App> *)this);
  pAVar4 = (App *)this->_vptr_BrokerBase;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_728,"--dumplog",(allocator<char> *)&local_a30);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_748,
             "capture a record of all messages and dump a complete log to file or console on termination"
             ,(allocator<char> *)&local_a58);
  CLI::App::add_flag<bool,_(CLI::detail::enabler)0>
            (pAVar4,&local_728,(bool *)(in_RSI + 0xda),&local_748);
  std::__cxx11::string::~string((string *)&local_748);
  std::__cxx11::string::~string((string *)&local_728);
  pAVar4 = (App *)this->_vptr_BrokerBase;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_768,"timeouts",(allocator<char> *)&local_a30);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_788,"Options related to network and process timeouts",
             (allocator<char> *)&local_a58);
  pAVar4 = &CLI::App::add_option_group<CLI::Option_group>(pAVar4,&local_768,&local_788)->super_App;
  std::__cxx11::string::~string((string *)&local_788);
  std::__cxx11::string::~string((string *)&local_768);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_7a8,"--tick",(allocator<char> *)&local_a30);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_7c8,
             "heartbeat time in ms, if there is no broker communication for 2 ticks then secondary actions are taken (can also be entered as a time like \'10s\' or \'45ms\')"
             ,(allocator<char> *)&local_a58);
  pOVar3 = CLI::App::
           add_option<TimeRepresentation<count_time<9,_long>_>,_TimeRepresentation<count_time<9,_long>_>,_(CLI::detail::enabler)0>
                     (pAVar4,&local_7a8,(TimeRepresentation<count_time<9,_long>_> *)(in_RSI + 0x30),
                      &local_7c8);
  CLI::Option::capture_default_str(pOVar3);
  std::__cxx11::string::~string((string *)&local_7c8);
  std::__cxx11::string::~string((string *)&local_7a8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_7e8,"--disable_timer,--no_tick",(allocator<char> *)&local_a30);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_808,
             "if set to true all timeouts are disabled, cannot be re-enabled later",
             (allocator<char> *)&local_a58);
  CLI::App::add_flag<bool,_(CLI::detail::enabler)0>
            (pAVar4,&local_7e8,(bool *)(in_RSI + 0xdc),&local_808);
  std::__cxx11::string::~string((string *)&local_808);
  std::__cxx11::string::~string((string *)&local_7e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_828,"--timeout",(allocator<char> *)&local_a30);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_848,
             "time to wait to establish a network or for a connection to communicate, default unit is in ms (can also be entered as a time like \'10s\' or \'45ms\') "
             ,(allocator<char> *)&local_a58);
  pOVar3 = CLI::App::
           add_option<TimeRepresentation<count_time<9,_long>_>,_TimeRepresentation<count_time<9,_long>_>,_(CLI::detail::enabler)0>
                     (pAVar4,&local_828,(TimeRepresentation<count_time<9,_long>_> *)(in_RSI + 0x38),
                      &local_848);
  CLI::Option::capture_default_str(pOVar3);
  std::__cxx11::string::~string((string *)&local_848);
  std::__cxx11::string::~string((string *)&local_828);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_868,"--networktimeout",(allocator<char> *)&local_a30);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_888,
             "time to wait for a broker connection, default unit is in ms (can also be entered as a time like \'10s\' or \'45ms\') "
             ,(allocator<char> *)&local_a58);
  pOVar3 = CLI::App::
           add_option<TimeRepresentation<count_time<9,_long>_>,_TimeRepresentation<count_time<9,_long>_>,_(CLI::detail::enabler)0>
                     (pAVar4,&local_868,(TimeRepresentation<count_time<9,_long>_> *)(in_RSI + 0x40),
                      &local_888);
  CLI::Option::capture_default_str(pOVar3);
  std::__cxx11::string::~string((string *)&local_888);
  std::__cxx11::string::~string((string *)&local_868);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_8a8,"--querytimeout",(allocator<char> *)&local_a30);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_8c8,
             "time to wait for a query to be answered; default unit is in ms  and default time is 15s (can also be entered as a time like \'10s\' or \'45ms\') "
             ,(allocator<char> *)&local_a58);
  CLI::App::
  add_option<TimeRepresentation<count_time<9,_long>_>,_TimeRepresentation<count_time<9,_long>_>,_(CLI::detail::enabler)0>
            (pAVar4,&local_8a8,(TimeRepresentation<count_time<9,_long>_> *)(in_RSI + 0x48),
             &local_8c8);
  std::__cxx11::string::~string((string *)&local_8c8);
  std::__cxx11::string::~string((string *)&local_8a8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_8e8,"--granttimeout",(allocator<char> *)&local_a30);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_908,
             "time to wait for a time request to be granted before triggering diagnostic actions; default is in ms (can also be entered as a time like \'10s\' or \'45ms\')"
             ,(allocator<char> *)&local_a58);
  CLI::App::
  add_option<TimeRepresentation<count_time<9,_long>_>,_TimeRepresentation<count_time<9,_long>_>,_(CLI::detail::enabler)0>
            (pAVar4,&local_8e8,(TimeRepresentation<count_time<9,_long>_> *)(in_RSI + 0x58),
             &local_908);
  std::__cxx11::string::~string((string *)&local_908);
  std::__cxx11::string::~string((string *)&local_8e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_928,"--maxcosimduration",(allocator<char> *)&local_a30);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_948,
             "the maximum time a broker/core should be active, the co-simulation will self terminate if it is still active after this duration, the time resolution is the tick timer (can also be entered as a time like \'10s\' or \'45ms\')"
             ,(allocator<char> *)&local_a58);
  pOVar3 = CLI::App::
           add_option<TimeRepresentation<count_time<9,_long>_>,_TimeRepresentation<count_time<9,_long>_>,_(CLI::detail::enabler)0>
                     (pAVar4,&local_928,(TimeRepresentation<count_time<9,_long>_> *)(in_RSI + 0x60),
                      &local_948);
  CLI::Option::multi_option_policy(pOVar3,TakeLast);
  std::__cxx11::string::~string((string *)&local_948);
  std::__cxx11::string::~string((string *)&local_928);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_968,"--errordelay,--errortimeout",(allocator<char> *)&local_a30);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_988,
             "time to wait after an error state before terminating like \'10s\' or \'45ms\') ",
             (allocator<char> *)&local_a58);
  pOVar3 = CLI::App::
           add_option<TimeRepresentation<count_time<9,_long>_>,_TimeRepresentation<count_time<9,_long>_>,_(CLI::detail::enabler)0>
                     (pAVar4,&local_968,(TimeRepresentation<count_time<9,_long>_> *)(in_RSI + 0x50),
                      &local_988);
  lVar1 = ((TimeRepresentation<count_time<9,_long>_> *)(in_RSI + 0x50))->internalTimeCode;
  std::__cxx11::to_string
            (&local_108,(double)(lVar1 % 1000000000) * 1e-09 + (double)(lVar1 / 1000000000));
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&pOVar3->default_str_,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_108);
  std::__cxx11::string::~string((string *)&local_108);
  std::__cxx11::string::~string((string *)&local_988);
  std::__cxx11::string::~string((string *)&local_968);
  sVar5.super___shared_ptr<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar5.super___shared_ptr<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<helics::helicsCLI11App>)
         sVar5.super___shared_ptr<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<helicsCLI11App> BrokerBase::generateBaseCLI()
{
    auto hApp = std::make_shared<helicsCLI11App>("Arguments applying to all Brokers and Cores");
    auto* fmtr = addJsonConfig(hApp.get());
    fmtr->maxLayers(0);
    fmtr->promoteSection("helics");
    hApp->option_defaults()->ignore_underscore()->ignore_case();
    hApp->add_option("--federates,-f",
                     minFederateCount,
                     "the minimum number of federates that will be connecting");
    hApp->add_option("--maxfederates",
                     maxFederateCount,
                     "the maximum number of federates that will be connecting");
    hApp->add_option("--name,-n,--identifier,--uuid", identifier, "the name of the broker/core");
    hApp->add_option("--max_iterations",
                     maxIterationCount,
                     "the maximum number of iterations allowed")
        ->capture_default_str();
    hApp->add_option(
        "--minbrokers,--minbroker,--minbrokercount",
        minBrokerCount,
        "the minimum number of cores/brokers that need to be connected (ignored in cores)");
    hApp->add_option(
        "--children,--subbrokers",
        minChildCount,
        "the minimum number of child objects that need to be connected before entering init mode");
    hApp->add_option("--maxbrokers",
                     maxBrokerCount,
                     "the maximum number of brokers that will be connecting (ignored in cores)");
    hApp->add_option("--brokerkey",
                     brokerKey,
                     "specify a key to use for all connections to/from a broker")
        ->envname("HELICS_BROKER_KEY");
    hApp->add_flag(
        "--slowresponding",
        no_ping,
        "specify that a broker might be slow or unresponsive to ping requests from other brokers");
    hApp->add_flag(
        "--restrictive_time_policy",
        restrictive_time_policy,
        "specify that a broker should use a conservative time policy in the time coordinator");
    hApp->add_flag(
        "--debugging",
        debugging,
        "specify that a broker/core should operate in user debugging mode equivalent to --slow_responding --disable_timer");
    hApp->add_flag(
        "--allow_remote_control,!--disable_remote_control",
        allowRemoteControl,
        "enable the broker to respond to certain remote commands that affect operations, such as disconnect");
    hApp->add_flag(
        "--globaltime",
        globalTime,
        "specify that the broker should use a globalTime coordinator to coordinate a master clock time with all federates");
    hApp->add_flag("--global_disconnect",
                   globalDisconnect,
                   "specify that all federates should delay disconnection until all are done");
    hApp->add_flag(
        "--asynctime",
        asyncTime,
        "specify that the federation should use the asynchronous time coordinator (only minimal time management is handled in HELICS and federates are allowed to operate independently)");
    hApp->add_option_function<std::string>(
            "--timing",
            [this](const std::string& arg) {
                if (arg == "async") {
                    asyncTime = true;
                } else if (arg == "global") {
                    globalTime = true;
                } else {
                    asyncTime = false;
                    globalTime = false;
                }
            },
            "specify the timing method to use in the broker")
        ->check(CLI::IsMember({"async", "global", "distributed", "default"}));
    hApp->add_flag("--observer",
                   observer,
                   "specify that the broker/core should be added as an observer only");
    hApp->add_flag("--dynamic",
                   dynamicFederation,
                   "specify that the broker/core should allow dynamic federates");
    hApp->add_flag(
        "--disable_dynamic_sources",
        disableDynamicSources,
        "specify that the data sources must be registered before entering Initializing mode");
    hApp->add_flag("--json",
                   useJsonSerialization,
                   "use the JSON serialization mode for communications");

    // add the profiling setup command
    auto* popt =
        hApp->add_option_function<std::string>(
                "--profiler",
                [this](const std::string& fileName) {
                    if (!fileName.empty()) {
                        if (fileName == "log" || fileName == "true") {
                            if (prBuff) {
                                prBuff.reset();
                            }
                        } else {
                            if (!prBuff) {
                                prBuff = std::make_shared<ProfilerBuffer>();
                            }
                            prBuff->setOutputFile(fileName, false);
                        }

                        enable_profiling = true;
                    } else {
                        enable_profiling = false;
                    }
                },
                "activate profiling and set the profiler data output file, set to empty string to disable profiling, set to \"log\" to route profile message to the logging system.")
            ->expected(0, 1)
            ->default_str("log");

    // add the profiling append file option
    hApp->add_option_function<std::string>(
            "--profiler_append",
            [this](const std::string& fileName) {
                if (!fileName.empty()) {
                    if (!prBuff) {
                        prBuff = std::make_shared<ProfilerBuffer>();
                    }
                    prBuff->setOutputFile(fileName, true);

                    enable_profiling = true;
                } else {
                    enable_profiling = false;
                }
            },
            "activate profiling and set the profiler data output file; new profiler output will be appended to the file")
        ->excludes(popt);

    hApp->add_flag("--terminate_on_error",
                   terminate_on_error,
                   "specify that a broker should cause the federation to terminate on an error");
    hApp->add_flag(
        "--error_on_unmatched",
        errorOnUnmatchedConnections,
        "set the broker to terminate the cosimulation if there are unmatched connections");
    mLogManager->addLoggingCLI(hApp);

    hApp->add_flag(
        "--dumplog",
        dumplog,
        "capture a record of all messages and dump a complete log to file or console on termination");

    auto* timeout_group =
        hApp->add_option_group("timeouts", "Options related to network and process timeouts");
    timeout_group
        ->add_option(
            "--tick",
            tickTimer,
            "heartbeat time in ms, if there is no broker communication for 2 ticks then "
            "secondary actions are taken (can also be entered as a time like '10s' or '45ms')")
        ->capture_default_str();
    timeout_group->add_flag("--disable_timer,--no_tick",
                            disable_timer,
                            "if set to true all timeouts are disabled, cannot be re-enabled later");
    timeout_group
        ->add_option(
            "--timeout",
            timeout,
            "time to wait to establish a network or for a connection to communicate, default "
            "unit is in ms (can also be entered as "
            "a time like '10s' or '45ms') ")
        ->capture_default_str();
    timeout_group
        ->add_option(
            "--networktimeout",
            networkTimeout,
            "time to wait for a broker connection, default unit is in ms (can also be entered as a time "
            "like '10s' or '45ms') ")
        ->capture_default_str();
    timeout_group->add_option(
        "--querytimeout",
        queryTimeout,
        "time to wait for a query to be answered; default unit is in ms  and default time is 15s (can also be entered as a time "
        "like '10s' or '45ms') ");
    timeout_group->add_option(
        "--granttimeout",
        grantTimeout,
        "time to wait for a time request to be granted before triggering diagnostic actions; default is in ms (can also be entered as a time "
        "like '10s' or '45ms')");
    timeout_group
        ->add_option(
            "--maxcosimduration",
            maxCoSimDuration,
            "the maximum time a broker/core should be active, the co-simulation will self terminate if it is still active after this duration, the time resolution is the tick timer (can also be entered as a time "
            "like '10s' or '45ms')")
        ->multi_option_policy(CLI::MultiOptionPolicy::TakeLast);
    timeout_group
        ->add_option("--errordelay,--errortimeout",
                     errorDelay,
                     "time to wait after an error state before terminating "
                     "like '10s' or '45ms') ")
        ->default_str(std::to_string(static_cast<double>(errorDelay)));

    return hApp;
}